

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission_parse.cpp
# Opt level: O3

FName __thiscall FMapInfoParser::CheckEndSequence(FMapInfoParser *this)

{
  byte bVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  FString *this_00;
  FIntermissionDescriptor *desc;
  FIntermissionAction *pFVar5;
  FMapInfoParser *in_RSI;
  char *pcVar6;
  FString seqname;
  FString local_40;
  FName local_34;
  
  bVar3 = FScanner::Compare(&in_RSI->sc,"endgame");
  if (bVar3) {
    bVar3 = FScanner::CheckString(&in_RSI->sc,"{");
    if (bVar3) {
      ParseEndGame(this);
      goto LAB_003060ca;
    }
    FScanner::UnGet(&in_RSI->sc);
LAB_00305fef:
    pcVar6 = "Inter_Pic3";
  }
  else {
    pcVar6 = (in_RSI->sc).String;
    iVar4 = strncasecmp(pcVar6,"EndGame",7);
    if (iVar4 == 0) {
      bVar1 = pcVar6[7];
      if (bVar1 < 0x43) {
        if (bVar1 == 0x31) {
          pcVar6 = "Inter_Pic1";
        }
        else {
          if (bVar1 != 0x32) {
            if (bVar1 == 0x33) goto LAB_00306029;
            goto LAB_00305fef;
          }
          pcVar6 = "Inter_Pic2";
        }
      }
      else if (bVar1 == 0x43) {
LAB_00306060:
        pcVar6 = "Inter_Cast";
      }
      else if (bVar1 == 0x53) {
        pcVar6 = "Inter_Strife";
      }
      else {
        if (bVar1 != 0x57) goto LAB_00305fef;
LAB_00306044:
        pcVar6 = "Inter_Underwater";
      }
    }
    else {
      bVar3 = FScanner::Compare(&in_RSI->sc,"endpic");
      if (bVar3) {
        ParseComma(in_RSI);
        FScanner::MustGetString(&in_RSI->sc);
        local_40.Chars = FString::NullString.Nothing;
        FString::NullString.RefCount = FString::NullString.RefCount + 1;
        this_00 = FString::operator+=(&local_40,"@EndPic_");
        FString::operator+=(this_00,(in_RSI->sc).String);
        desc = (FIntermissionDescriptor *)operator_new(0x18);
        (desc->mLink).Index = 0;
        (desc->mActions).super_TArray<FIntermissionAction_*,_FIntermissionAction_*>.Array =
             (FIntermissionAction **)0x0;
        (desc->mActions).super_TArray<FIntermissionAction_*,_FIntermissionAction_*>.Most = 0;
        (desc->mActions).super_TArray<FIntermissionAction_*,_FIntermissionAction_*>.Count = 0;
        pFVar5 = (FIntermissionAction *)operator_new(0x60);
        pFVar5->_vptr_FIntermissionAction = (_func_int **)&PTR__FIntermissionAction_006ec860;
        (pFVar5->mMusic).Chars = (char *)0x723dac;
        (pFVar5->mBackground).Chars = (char *)0x723dac;
        (pFVar5->mPalette).Chars = (char *)0x723dac;
        (pFVar5->mSound).Chars = (char *)0x723dac;
        FString::NullString.RefCount = FString::NullString.RefCount + 4;
        (pFVar5->mOverlays).Array = (FIntermissionPatch *)0x0;
        (pFVar5->mOverlays).Most = 0;
        (pFVar5->mOverlays).Count = 0;
        pFVar5->mSize = 0x60;
        pFVar5->mClass = DIntermissionScreen::RegistrationInfo.MyClass;
        pFVar5->mFlatfill = false;
        pFVar5->mMusicLooping = true;
        pFVar5->mMusicOrder = 0;
        pFVar5->mCdTrack = 0;
        pFVar5->mCdId = 0;
        pFVar5->mDuration = 0;
        FString::operator=(&pFVar5->mBackground,(in_RSI->sc).String);
        TArray<FIntermissionAction_*,_FIntermissionAction_*>::Grow
                  (&(desc->mActions).super_TArray<FIntermissionAction_*,_FIntermissionAction_*>,1);
        uVar2 = (desc->mActions).super_TArray<FIntermissionAction_*,_FIntermissionAction_*>.Count;
        (desc->mActions).super_TArray<FIntermissionAction_*,_FIntermissionAction_*>.Array[uVar2] =
             pFVar5;
        (desc->mActions).super_TArray<FIntermissionAction_*,_FIntermissionAction_*>.Count =
             uVar2 + 1;
        local_34.Index =
             FName::NameManager::FindName
                       (&FName::NameData,local_40.Chars,
                        (ulong)((FNullStringData *)(local_40.Chars + -0xc))->Len,false);
        ReplaceIntermission(&local_34,desc);
        iVar4 = FName::NameManager::FindName
                          (&FName::NameData,local_40.Chars,
                           (ulong)((FNullStringData *)(local_40.Chars + -0xc))->Len,false);
        *(int *)&(this->sc).String = iVar4;
        FString::~FString(&local_40);
        goto LAB_003060ca;
      }
      bVar3 = FScanner::Compare(&in_RSI->sc,"endbunny");
      if (bVar3) {
LAB_00306029:
        pcVar6 = "Inter_Bunny";
      }
      else {
        bVar3 = FScanner::Compare(&in_RSI->sc,"endcast");
        if (bVar3) goto LAB_00306060;
        bVar3 = FScanner::Compare(&in_RSI->sc,"enddemon");
        if (bVar3) {
          pcVar6 = "Inter_Demonscroll";
        }
        else {
          bVar3 = FScanner::Compare(&in_RSI->sc,"endchess");
          if (bVar3) {
            pcVar6 = "Inter_Chess";
          }
          else {
            bVar3 = FScanner::Compare(&in_RSI->sc,"endunderwater");
            if (bVar3) goto LAB_00306044;
            bVar3 = FScanner::Compare(&in_RSI->sc,"endbuystrife");
            if (bVar3) {
              pcVar6 = "Inter_BuyStrife";
            }
            else {
              bVar3 = FScanner::Compare(&in_RSI->sc,"endtitle");
              if (!bVar3) {
                bVar3 = FScanner::Compare(&in_RSI->sc,"endsequence");
                if (bVar3) {
                  ParseComma(in_RSI);
                  FScanner::MustGetString(&in_RSI->sc);
                  pcVar6 = (in_RSI->sc).String;
                  if (pcVar6 != (char *)0x0) goto LAB_003060ba;
                }
                *(undefined4 *)&(this->sc).String = 0;
                goto LAB_003060ca;
              }
              pcVar6 = "Inter_Titlescreen";
            }
          }
        }
      }
    }
  }
LAB_003060ba:
  iVar4 = FName::NameManager::FindName(&FName::NameData,pcVar6,false);
  *(int *)&(this->sc).String = iVar4;
LAB_003060ca:
  return (FName)(int)this;
}

Assistant:

FName FMapInfoParser::CheckEndSequence()
{
	const char *seqname = NULL;

	if (sc.Compare("endgame"))
	{
		if (!sc.CheckString("{"))
		{
			// Make Demon Eclipse work again
			sc.UnGet();
			goto standard_endgame;
		}
		return ParseEndGame();
	}
	else if (strnicmp (sc.String, "EndGame", 7) == 0)
	{
		switch (sc.String[7])
		{
		case '1':	seqname = "Inter_Pic1";		break;
		case '2':	seqname = "Inter_Pic2";		break;
		case '3':	seqname = "Inter_Bunny";	break;
		case 'C':	seqname = "Inter_Cast";		break;
		case 'W':	seqname = "Inter_Underwater";	break;
		case 'S':	seqname = "Inter_Strife";	break;
	standard_endgame:
		default:	seqname = "Inter_Pic3";		break;
		}
	}
	else if (sc.Compare("endpic"))
	{
		ParseComma();
		sc.MustGetString ();
		FString seqname;
		seqname << "@EndPic_" << sc.String;
		FIntermissionDescriptor *desc = new FIntermissionDescriptor;
		FIntermissionAction *action = new FIntermissionAction;
		action->mBackground = sc.String;
		desc->mActions.Push(action);
		ReplaceIntermission(seqname, desc);
		return FName(seqname);
	}
	else if (sc.Compare("endbunny"))
	{
		seqname = "Inter_Bunny";
	}
	else if (sc.Compare("endcast"))
	{
		seqname = "Inter_Cast";
	}
	else if (sc.Compare("enddemon"))
	{
		seqname = "Inter_Demonscroll";
	}
	else if (sc.Compare("endchess"))
	{
		seqname = "Inter_Chess";
	}
	else if (sc.Compare("endunderwater"))
	{
		seqname = "Inter_Underwater";
	}
	else if (sc.Compare("endbuystrife"))
	{
		seqname = "Inter_BuyStrife";
	}
	else if (sc.Compare("endtitle"))
	{
		seqname = "Inter_Titlescreen";
	}
	else if (sc.Compare("endsequence"))
	{
		ParseComma();
		sc.MustGetString();
		seqname = sc.String;
	}

	if (seqname != NULL)
	{
		return FName(seqname);
	}
	return NAME_None;
}